

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyBoundedValue::~IfcPropertyBoundedValue
          (IfcPropertyBoundedValue *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  *(undefined ***)this = &PTR__IfcPropertyBoundedValue_00811320;
  *(undefined ***)&this->field_0xc0 = &PTR__IfcPropertyBoundedValue_00811398;
  *(undefined ***)&this->field_0x58 = &PTR__IfcPropertyBoundedValue_00811348;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyBoundedValue,_3UL>).
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcPropertyBoundedValue_00811370;
  p_Var1 = (this->Unit).ptr.
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->LowerBoundValue).ptr.
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyBoundedValue,_3UL>).
             field_0x18;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  *(undefined8 *)this = 0x8114b0;
  *(undefined8 *)&this->field_0xc0 = 0x8114d8;
  if (*(undefined1 **)&this->field_0x30 != &this->field_0x40) {
    operator_delete(*(undefined1 **)&this->field_0x30,*(long *)&this->field_0x40 + 1);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  operator_delete(this,0xd8);
  return;
}

Assistant:

IfcPropertyBoundedValue() : Object("IfcPropertyBoundedValue") {}